

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

Aig_Man_t * Saig_ManCreateMiterComb(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int local_34;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int Oper_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  iVar1 = Aig_ManCiNum(p0);
  iVar2 = Aig_ManCiNum(p1);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(p0) == Aig_ManCiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                  ,0xa8,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManCoNum(p0);
  iVar2 = Aig_ManCoNum(p1);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCoNum(p0) == Aig_ManCoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                  ,0xa9,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManObjNumMax(p0);
  iVar2 = Aig_ManObjNumMax(p1);
  p = Aig_ManStart(iVar1 + iVar2);
  pcVar3 = Abc_UtilStrsav("miter");
  p->pName = pcVar3;
  pAVar4 = Aig_ManConst1(p);
  pAVar5 = Aig_ManConst1(p0);
  (pAVar5->field_5).pData = pAVar4;
  pAVar4 = Aig_ManConst1(p);
  pAVar5 = Aig_ManConst1(p1);
  (pAVar5->field_5).pData = pAVar4;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p0->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar6 = Vec_PtrEntry(p0->vCis,local_34);
    pAVar4 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p1->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar6 = Vec_PtrEntry(p1->vCis,local_34);
    pAVar4 = Aig_ManCi(p,local_34);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p0->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_34);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      pAVar7 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p,pAVar5,pAVar7);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p1->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,local_34);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      pAVar7 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p,pAVar5,pAVar7);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p0->vCos);
    if (iVar1 <= local_34) {
      Aig_ManSetRegNum(p,0);
      Aig_ManCleanup(p);
      return p;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,local_34);
    if (Oper == 0) {
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      pAVar5 = Aig_ManCo(p1,local_34);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      pAStack_30 = Aig_Exor(p,pAVar4,pAVar5);
    }
    else {
      if (Oper != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                      ,0xc1,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
      }
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      pAVar5 = Aig_ManCo(p1,local_34);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      pAVar5 = Aig_Not(pAVar5);
      pAStack_30 = Aig_And(p,pAVar4,pAVar5);
    }
    Aig_ObjCreateCo(p,pAStack_30);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCreateMiterComb( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p0) == Aig_ManCiNum(p1) );
    assert( Aig_ManCoNum(p0) == Aig_ManCoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs and register outputs
    Aig_ManForEachCi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Aig_ManForEachCo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // cleanup
    Aig_ManSetRegNum( pNew, 0 );
    Aig_ManCleanup( pNew );
    return pNew;
}